

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  DescriptorPool *this_00;
  bool bVar4;
  char *pcVar5;
  Nonnull<const_char_*> failure_msg;
  FieldDescriptor *field;
  int iVar6;
  int iVar7;
  uint number;
  uint32_t tag;
  char *local_50;
  uint local_44;
  LogMessageFatal local_40;
  
  local_50 = ptr;
  do {
    bVar4 = ParseContext::Done(ctx,&local_50);
    if (bVar4) {
      return local_50;
    }
    local_50 = ReadTag(local_50,&local_44,0);
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
    if ((local_44 == 0) || ((local_44 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      return local_50;
    }
    if (local_44 == 0xb) {
      iVar7 = ctx->depth_;
      iVar6 = iVar7 + -1;
      ctx->depth_ = iVar6;
      if (iVar7 < 1) {
        return (char *)0x0;
      }
      iVar7 = ctx->group_depth_ + 1;
      ctx->group_depth_ = iVar7;
      pcVar5 = ParseElement(this,local_50,ctx);
      if (pcVar5 != (char *)0x0) {
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar6,ctx->depth_,"old_depth == depth_");
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          iVar6 = 0x491;
LAB_003ba3b8:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                     ,iVar6,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar7,ctx->group_depth_,"old_group_depth == group_depth_");
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          iVar6 = 0x492;
          goto LAB_003ba3b8;
        }
      }
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar3 != 0xb) {
        return (char *)0x0;
      }
    }
    else {
      number = local_44 >> 3;
      bVar4 = Descriptor::IsExtensionNumber(this->descriptor,number);
      if (bVar4) {
        this_00 = (ctx->data_).pool;
        if (this_00 == (DescriptorPool *)0x0) {
          field = Reflection::FindKnownExtensionByNumber(this->reflection,number);
        }
        else {
          field = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor,number);
        }
      }
      else {
        field = (FieldDescriptor *)0x0;
      }
      pcVar5 = _InternalParseAndMergeField
                         (this->msg,local_50,ctx,(ulong)local_44,this->reflection,field);
    }
    local_50 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }